

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O3

ze_result_t
validation_layer::zesFabricPortGetProperties
          (zes_fabric_port_handle_t hPort,zes_fabric_port_properties_t *pProperties)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  ze_result_t result;
  ze_result_t zVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar7 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zesFabricPortGetProperties(hPort, pProperties)","");
  if (*(char *)(lVar7 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar7 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(context + 0xbe0);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar7 = *(long *)(context + 0xd30);
    lVar2 = *(long *)(context + 0xd38);
    lVar5 = lVar2 - lVar7 >> 3;
    if (lVar2 != lVar7) {
      lVar6 = 0;
      do {
        plVar3 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar6 * 8) + 8);
        result = (**(code **)(*plVar3 + 0x2c0))(plVar3,hPort,pProperties);
        if (result != ZE_RESULT_SUCCESS) goto LAB_00179c18;
        lVar6 = lVar6 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
    }
    lVar6 = context;
    if (((*(char *)(context + 4) != '\x01') ||
        (result = ZESHandleLifetimeValidation::zesFabricPortGetPropertiesPrologue
                            ((ZESHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 8),hPort,
                             pProperties), result == ZE_RESULT_SUCCESS)) &&
       (zVar4 = (*pcVar1)(hPort,pProperties), result = zVar4, lVar2 != lVar7)) {
      lVar7 = 0;
      do {
        plVar3 = *(long **)(*(long *)(*(long *)(lVar6 + 0xd30) + lVar7 * 8) + 8);
        result = (**(code **)(*plVar3 + 0x2c8))(plVar3,hPort,pProperties,zVar4);
        if (result != ZE_RESULT_SUCCESS) break;
        lVar7 = lVar7 + 1;
        result = zVar4;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
    }
  }
LAB_00179c18:
  logAndPropagateResult("zesFabricPortGetProperties",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFabricPortGetProperties(
        zes_fabric_port_handle_t hPort,                 ///< [in] Handle for the component.
        zes_fabric_port_properties_t* pProperties       ///< [in,out] Will contain properties of the Fabric Port.
        )
    {
        context.logger->log_trace("zesFabricPortGetProperties(hPort, pProperties)");

        auto pfnGetProperties = context.zesDdiTable.FabricPort.pfnGetProperties;

        if( nullptr == pfnGetProperties )
            return logAndPropagateResult("zesFabricPortGetProperties", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesFabricPortGetPropertiesPrologue( hPort, pProperties );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesFabricPortGetProperties", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesFabricPortGetPropertiesPrologue( hPort, pProperties );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesFabricPortGetProperties", result);
        }

        auto driver_result = pfnGetProperties( hPort, pProperties );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesFabricPortGetPropertiesEpilogue( hPort, pProperties ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesFabricPortGetProperties", result);
        }

        return logAndPropagateResult("zesFabricPortGetProperties", driver_result);
    }